

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_base.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::ToBaseFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalType varargs;
  LogicalType varargs_00;
  ScalarFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffffc24;
  undefined4 in_stack_fffffffffffffc2c;
  FunctionNullHandling in_stack_fffffffffffffc38;
  allocator_type local_3c1;
  code *local_3b8 [2];
  code *local_3a8;
  code *local_3a0;
  code *local_398 [2];
  code *local_388;
  code *local_380;
  LogicalType local_378;
  LogicalType local_360 [3];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_318;
  LogicalType local_300;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2e8;
  LogicalType local_2d0;
  LogicalType local_2b8;
  string local_2a0;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  ::std::__cxx11::string::string((string *)&local_2a0,"to_base",(allocator *)local_360);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_2a0);
  ::std::__cxx11::string::~string((string *)&local_2a0);
  LogicalType::LogicalType(local_360,BIGINT);
  LogicalType::LogicalType(local_360 + 1,INTEGER);
  __l._M_len = 2;
  __l._M_array = local_360;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2e8,__l,&local_3c1);
  LogicalType::LogicalType(&local_300,VARCHAR);
  local_398[1] = (code *)0x0;
  local_398[0] = ToBaseFunction;
  local_380 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_388 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  LogicalType::LogicalType(&local_2b8,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_2b8;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffc24;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffc2c;
  ScalarFunction::ScalarFunction
            (&local_158,(vector<duckdb::LogicalType,_true> *)&local_2e8,&local_300,
             (scalar_function_t *)local_398,ToBaseBind,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_fffffffffffffc38,(bind_lambda_function_t)in_RDI);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_158);
  ScalarFunction::~ScalarFunction(&local_158);
  LogicalType::~LogicalType(&local_2b8);
  ::std::_Function_base::~_Function_base((_Function_base *)local_398);
  LogicalType::~LogicalType(&local_300);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2e8);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_360[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::LogicalType(local_360,BIGINT);
  LogicalType::LogicalType(local_360 + 1,INTEGER);
  LogicalType::LogicalType(local_360 + 2,INTEGER);
  __l_00._M_len = 3;
  __l_00._M_array = local_360;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_318,__l_00,&local_3c1);
  LogicalType::LogicalType(&local_378,VARCHAR);
  local_3b8[1] = (code *)0x0;
  local_3b8[0] = ToBaseFunction;
  local_3a0 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_3a8 = ::std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  LogicalType::LogicalType(&local_2d0,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_2d0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffffc24;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffffc2c;
  ScalarFunction::ScalarFunction
            (&local_280,(vector<duckdb::LogicalType,_true> *)&local_318,&local_378,
             (scalar_function_t *)local_3b8,ToBaseBind,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
             in_stack_fffffffffffffc38,(bind_lambda_function_t)in_RDI);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_280);
  ScalarFunction::~ScalarFunction(&local_280);
  LogicalType::~LogicalType(&local_2d0);
  ::std::_Function_base::~_Function_base((_Function_base *)local_3b8);
  LogicalType::~LogicalType(&local_378);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_318);
  lVar1 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_360[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return in_RDI;
}

Assistant:

ScalarFunctionSet ToBaseFun::GetFunctions() {
	ScalarFunctionSet set("to_base");

	set.AddFunction(
	    ScalarFunction({LogicalType::BIGINT, LogicalType::INTEGER}, LogicalType::VARCHAR, ToBaseFunction, ToBaseBind));
	set.AddFunction(ScalarFunction({LogicalType::BIGINT, LogicalType::INTEGER, LogicalType::INTEGER},
	                               LogicalType::VARCHAR, ToBaseFunction, ToBaseBind));

	return set;
}